

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<0,_1,_1>::propagate(BinGE<0,_1,_1> *this)

{
  BoolView *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Lit LVar5;
  int iVar6;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar7;
  IntVar *pIVar8;
  int64_t m_v;
  long lVar9;
  
  this_00 = &this->r;
  bVar1 = BoolView::isFalse(this_00);
  if (!bVar1) {
    pIVar8 = (this->x).var;
    iVar6 = (pIVar8->max).v;
    lVar9 = -(long)(((this->y).var)->max).v;
    iVar4 = (int)lVar9;
    if ((iVar6 < iVar4) && ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v]))
    {
      if (so.lazy == true) {
        iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])();
        uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        r._a = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      bVar1 = BoolView::setVal(this_00,false,(Reason)r);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = BoolView::isTrue(this_00);
    if (bVar1) {
      pIVar8 = (this->x).var;
      if ((pIVar8->min).v < iVar4) {
        if (so.lazy == true) {
          iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
          LVar5 = BoolView::getValLit(this_00);
          uVar7 = (ulong)(uint)LVar5.x << 0x20 | (long)iVar4 << 2 | 3;
          pIVar8 = (this->x).var;
        }
        else {
          uVar7 = 0;
        }
        iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])(pIVar8,lVar9,uVar7,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      pIVar8 = (this->y).var;
      iVar4 = (pIVar8->min).v;
      iVar2 = -iVar4;
      if (SBORROW4(iVar6,iVar2) != iVar6 + iVar4 < 0) {
        if (so.lazy == true) {
          iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          LVar5 = BoolView::getValLit(this_00);
          uVar7 = (ulong)(uint)LVar5.x << 0x20 | (long)iVar4 << 2 | 3;
          pIVar8 = (this->y).var;
        }
        else {
          uVar7 = 0;
        }
        iVar6 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar8,-(long)iVar6,uVar7,1);
        if ((char)iVar6 == '\0') {
          return false;
        }
        iVar2 = -(((this->y).var)->min).v;
      }
      if (iVar2 <= (((this->x).var)->min).v) {
        Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}